

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xdr_inline.h
# Opt level: O3

bool_t xdr_union(XDR *__xdrs,enum_t *__dscmp,char *__unp,xdr_discrim *__choices,xdrproc_t __dfault)

{
  uint *puVar1;
  xdr_discrim *pxVar2;
  xdr_op xVar3;
  uint uVar4;
  char cVar5;
  _Bool _Var6;
  undefined7 extraout_var;
  code *UNRECOVERED_JUMPTABLE;
  xdrproc_t *extraout_RDX;
  xdrproc_t *extraout_RDX_00;
  xdrproc_t *pp_Var7;
  xdrproc_t *pp_Var8;
  
  xVar3 = __xdrs[2].x_op;
  pp_Var7 = (xdrproc_t *)__unp;
  if (xVar3 != XDR_FREE) {
    if (xVar3 == XDR_DECODE) {
      puVar1 = *(uint **)&__xdrs->x_handy + 1;
      if (puVar1 <= __xdrs[1].x_private) {
        uVar4 = **(uint **)&__xdrs->x_handy;
        *__dscmp = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        *(uint **)&__xdrs->x_handy = puVar1;
        goto LAB_00112cc5;
      }
      cVar5 = (*(code *)**(undefined8 **)__xdrs)(__xdrs,__dscmp);
      pp_Var7 = extraout_RDX_00;
    }
    else {
      if (xVar3 != XDR_ENCODE) {
        return 0;
      }
      uVar4 = *__dscmp;
      puVar1 = *(uint **)&__xdrs->x_handy + 1;
      if (puVar1 <= __xdrs[1].x_base) {
        **(uint **)&__xdrs->x_handy =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        *(uint **)&__xdrs->x_handy = puVar1;
        goto LAB_00112cc5;
      }
      cVar5 = (**(code **)(*(long *)__xdrs + 8))(__xdrs);
      pp_Var7 = extraout_RDX;
    }
    if (cVar5 == '\0') {
      return 0;
    }
  }
LAB_00112cc5:
  if (*__dscmp == 0) {
    UNRECOVERED_JUMPTABLE = xdr_naccepted_reply;
  }
  else {
    pp_Var8 = &reply_dscrm[1].proc;
    do {
      UNRECOVERED_JUMPTABLE = *pp_Var8;
      if (UNRECOVERED_JUMPTABLE == (xdrproc_t)0x0) {
        return 0;
      }
      pp_Var7 = pp_Var8 + 2;
      pxVar2 = (xdr_discrim *)(pp_Var8 + -1);
      pp_Var8 = pp_Var7;
    } while (pxVar2->value != *__dscmp);
  }
  _Var6 = (*UNRECOVERED_JUMPTABLE)((XDR *)__xdrs,__unp,pp_Var7,UNRECOVERED_JUMPTABLE);
  return (bool_t)CONCAT71(extraout_var,_Var6);
}

Assistant:

static inline bool
xdr_union(XDR *xdrs,
	  enum_t *dscmp,	/* enum to decide which arm to work on */
	  void *unp,		/* the union itself */
	  const struct xdr_discrim *choices,
				/* [value, xdr proc] for each arm */
	  xdrproc_t dfault /* default xdr routine */)
{
	enum_t dscm;

	/*
	 * we deal with the discriminator;  it's an enum
	 */
	if (!inline_xdr_enum(xdrs, dscmp))
		return (false);
	dscm = *dscmp;

	/*
	 * search choices for a value that matches the discriminator.
	 * if we find one, execute the xdr routine for that value.
	 */
	for (; choices->proc != NULL_xdrproc_t; choices++) {
		if (choices->value == dscm)
			return ((*(choices->proc)) (xdrs, unp));
	}

	/*
	 * no match - execute the default xdr routine if there is one
	 */
	return ((dfault == NULL_xdrproc_t) ? false : (*dfault) (xdrs, unp));
}